

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexSubImageCubeBufferCase::createTexture(TexSubImageCubeBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  TextureFormatInfo *b;
  Vec4 *a;
  int iVar1;
  int iVar2;
  int iVar3;
  TransferFormat TVar4;
  deUint32 seed;
  int iVar5;
  int iVar6;
  uint rowPitch;
  long lVar7;
  deUint32 buf;
  TransferFormat local_118;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 gMax;
  Vec4 gMin;
  Vec4 colorB;
  PixelBufferAccess local_90;
  Vec4 colorA;
  Random rnd;
  Vector<float,_4> local_48;
  
  seed = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                      super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  this_01 = &(this->super_TextureCubeSpecCase).m_texFormat;
  local_118 = glu::getTransferFormat((this->super_TextureCubeSpecCase).m_texFormat);
  iVar5 = tcu::TextureFormat::getPixelSize(this_01);
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  iVar6 = (this->super_TextureCubeSpecCase).m_size;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((iVar6 * iVar5 + 3U & 0xfffffffc) * iVar6));
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  TVar4 = local_118;
  b = &(this->super_TextureCubeSpecCase).m_texFormatInfo;
  a = &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax;
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 4) {
    randomVector<4>((Functional *)&gMin,&rnd,&b->valueMin,a);
    randomVector<4>((Functional *)&gMax,&rnd,&b->valueMin,a);
    iVar6 = (this->super_TextureCubeSpecCase).m_size;
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_90,this_01,iVar6,iVar6,1,iVar6 * iVar5 + 3U & 0xfffffffc,0,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tcu::fillWithComponentGradients(&local_90,&gMin,&gMax);
    iVar6 = (this->super_TextureCubeSpecCase).m_size;
    sglr::ContextWrapper::glTexImage2D
              (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar7),0,this->m_internalFormat,iVar6,
               iVar6,0,local_118.format,TVar4.dataType,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  iVar6 = this->m_rowLength;
  iVar1 = this->m_skipRows;
  if (iVar6 < 1) {
    iVar6 = this->m_subW;
  }
  iVar2 = this->m_alignment;
  iVar3 = this->m_subH;
  tcu::operator-((tcu *)&gMin,a,&b->valueMin);
  tcu::Vector<float,_4>::Vector(&gMax,&b->valueMin);
  colorB.m_data[0] = 1.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_90,&colorB,&gMin);
  tcu::operator+((tcu *)&colorA,(Vector<float,_4> *)&local_90,&gMax);
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_90,&local_48,&gMin);
  tcu::operator+((tcu *)&colorB,(Vector<float,_4> *)&local_90,&gMax);
  rowPitch = -iVar2 & (iVar2 + iVar6 * iVar5) - 1U;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((iVar1 + iVar3) * rowPitch + this->m_offset));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_90,this_01,this->m_subW,this->m_subH,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)this->m_offset + (long)(this->m_skipPixels * iVar5) +
             (long)(int)(this->m_skipRows * rowPitch));
  tcu::fillWithGrid(&local_90,4,&colorA,&colorB);
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 4) {
    sglr::ContextWrapper::glTexSubImage2D
              (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar7),0,this->m_subX,this->m_subY,
               this->m_subW,this->m_subH,local_118.format,TVar4.dataType,
               (void *)(long)this->m_offset);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		de::Random				rnd				(deStringHash(getName()));
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		// Fill faces with different gradients.

		data.resize(deAlign32(m_size*pixelSize, 4)*m_size);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
		{
			const Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			const Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, 1, deAlign32(m_size*pixelSize, 4), 0, &data[0]), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], 0, m_internalFormat, m_size, m_size, 0, transferFmt.format, transferFmt.dataType, &data[0]);
		}

		// Fill data with grid.
		{
			int		rowLength	= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
			int		height		= m_subH + m_skipRows;
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(rowPitch*height + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexSubImage2D(s_cubeMapFaces[face], 0, m_subX, m_subY, m_subW, m_subH, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}